

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeTripAllCursors(Btree *pBtree,int errCode,int writeOnly)

{
  int local_24;
  BtCursor *pBStack_20;
  int rc;
  BtCursor *p;
  int writeOnly_local;
  int errCode_local;
  Btree *pBtree_local;
  
  local_24 = 0;
  if (pBtree != (Btree *)0x0) {
    sqlite3BtreeEnter(pBtree);
    for (pBStack_20 = pBtree->pBt->pCursor; pBStack_20 != (BtCursor *)0x0;
        pBStack_20 = pBStack_20->pNext) {
      if ((writeOnly == 0) || ((pBStack_20->curFlags & 1) != 0)) {
        sqlite3BtreeClearCursor(pBStack_20);
        pBStack_20->eState = '\x04';
        pBStack_20->skipNext = errCode;
      }
      else if (((pBStack_20->eState == '\0') || (pBStack_20->eState == '\x02')) &&
              (local_24 = saveCursorPosition(pBStack_20), local_24 != 0)) {
        sqlite3BtreeTripAllCursors(pBtree,local_24,0);
        break;
      }
      btreeReleaseAllCursorPages(pBStack_20);
    }
    sqlite3BtreeLeave(pBtree);
  }
  return local_24;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTripAllCursors(Btree *pBtree, int errCode, int writeOnly){
  BtCursor *p;
  int rc = SQLITE_OK;

  assert( (writeOnly==0 || writeOnly==1) && BTCF_WriteFlag==1 );
  if( pBtree ){
    sqlite3BtreeEnter(pBtree);
    for(p=pBtree->pBt->pCursor; p; p=p->pNext){
      if( writeOnly && (p->curFlags & BTCF_WriteFlag)==0 ){
        if( p->eState==CURSOR_VALID || p->eState==CURSOR_SKIPNEXT ){
          rc = saveCursorPosition(p);
          if( rc!=SQLITE_OK ){
            (void)sqlite3BtreeTripAllCursors(pBtree, rc, 0);
            break;
          }
        }
      }else{
        sqlite3BtreeClearCursor(p);
        p->eState = CURSOR_FAULT;
        p->skipNext = errCode;
      }
      btreeReleaseAllCursorPages(p);
    }
    sqlite3BtreeLeave(pBtree);
  }
  return rc;
}